

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

uint32_t gravity_list_size(gravity_vm *vm,gravity_list_t *list)

{
  gravity_value_t *pgVar1;
  uint32_t uVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  gravity_value_t v;
  
  (list->gc).visited = true;
  sVar5 = (list->array).n;
  iVar3 = 0;
  lVar4 = 8;
  while (bVar6 = sVar5 != 0, sVar5 = sVar5 - 1, bVar6) {
    pgVar1 = (list->array).p;
    v.field_1.n = ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&pgVar1->isa + lVar4))->n
    ;
    v.isa = *(gravity_class_t **)((long)pgVar1 + lVar4 + -8);
    uVar2 = gravity_value_size(vm,v);
    iVar3 = iVar3 + uVar2;
    lVar4 = lVar4 + 0x10;
  }
  (list->gc).visited = false;
  return iVar3 + 0x48;
}

Assistant:

uint32_t gravity_list_size (gravity_vm *vm, gravity_list_t *list) {
    SET_OBJECT_VISITED_FLAG(list, true);
    
    uint32_t internal_size = 0;
    size_t count = marray_size(list->array);
    for (size_t i=0; i<count; ++i) {
        internal_size += gravity_value_size(vm, marray_get(list->array, i));
    }
    internal_size += sizeof(gravity_list_t);
    
    SET_OBJECT_VISITED_FLAG(list, false);
    return internal_size;
}